

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_enc.cc
# Opt level: O0

bool __thiscall
bssl::tls1_configure_aead
          (bssl *this,SSL *ssl,evp_aead_direction_t direction,Array<unsigned_char> *key_block_cache,
          SSL_SESSION *session,Span<const_unsigned_char> iv_override)

{
  code *pcVar1;
  Span<const_unsigned_char> fixed_iv;
  bssl *pbVar2;
  bool bVar3;
  byte bVar4;
  size_t sVar5;
  size_t sVar6;
  undefined4 in_register_00000014;
  SSL_SESSION *session_00;
  uchar *in_R9;
  Span<const_unsigned_char> SVar7;
  Span<const_unsigned_char> enc_key;
  Span<unsigned_char> out;
  Span<const_unsigned_char> local_190;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_180 [3];
  Span<const_unsigned_char> local_168;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_158;
  undefined4 local_14c;
  _Head_base<0UL,_bssl::SSLAEADContext_*,_false> local_148;
  uchar *local_140;
  size_t local_138;
  uchar *local_130;
  size_t local_128;
  uchar *local_120;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_118;
  UniquePtr<SSLAEADContext> aead_ctx;
  uchar *local_108;
  uchar *local_100;
  uchar *local_f8;
  uchar *local_f0;
  uchar *local_e8;
  _Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter> local_e0;
  uchar *local_d8;
  uchar *local_d0;
  uchar *local_c8;
  uchar *local_c0;
  uchar *local_b8;
  undefined1 local_b0 [8];
  Span<const_unsigned_char> iv;
  Span<const_unsigned_char> key;
  Span<const_unsigned_char> mac_secret;
  Span<const_unsigned_char> key_block;
  uchar *local_68;
  size_t key_block_size;
  size_t iv_len;
  size_t key_len;
  size_t mac_secret_len;
  SSL_SESSION *session_local;
  Array<unsigned_char> *key_block_cache_local;
  bssl *pbStack_28;
  evp_aead_direction_t direction_local;
  SSL *ssl_local;
  Span<const_unsigned_char> iv_override_local;
  
  session_local = (SSL_SESSION *)CONCAT44(in_register_00000014,direction);
  key_block_cache_local._4_4_ = (uint)ssl;
  session_00 = (SSL_SESSION *)key_block_cache[0xd].size_;
  mac_secret_len = (size_t)key_block_cache;
  pbStack_28 = this;
  ssl_local = (SSL *)session;
  iv_override_local.data_ = in_R9;
  bVar3 = get_key_block_lengths
                    ((SSL *)this,&key_len,&iv_len,&key_block_size,(SSL_CIPHER *)session_00);
  if (!bVar3) {
    iv_override_local.size_._7_1_ = 0;
    goto LAB_003947fd;
  }
  sVar5 = (key_len + iv_len + key_block_size) * 2;
  bVar3 = Array<unsigned_char>::empty((Array<unsigned_char> *)session_local);
  if (bVar3) {
    bVar3 = Array<unsigned_char>::InitForOverwrite((Array<unsigned_char> *)session_local,sVar5);
    pbVar2 = pbStack_28;
    if (bVar3) {
      Span<unsigned_char>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char> *)&key_block.size_,(Array<unsigned_char> *)session_local);
      out.size_ = mac_secret_len;
      out.data_ = local_68;
      bVar3 = generate_key_block(pbVar2,(SSL *)key_block.size_,out,session_00);
      if (bVar3) goto LAB_00394343;
    }
    iv_override_local.size_._7_1_ = 0;
  }
  else {
LAB_00394343:
    sVar6 = Array<unsigned_char>::size((Array<unsigned_char> *)session_local);
    if (sVar6 != sVar5) {
      __assert_fail("key_block_cache->size() == key_block_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/t1_enc.cc"
                    ,100,
                    "bool bssl::tls1_configure_aead(SSL *, evp_aead_direction_t, Array<uint8_t> *, const SSL_SESSION *, Span<const uint8_t>)"
                   );
    }
    Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&mac_secret.size_,(Array<unsigned_char> *)session_local)
    ;
    Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)&key.size_);
    Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)&iv.size_);
    Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_b0);
    if (key_block_cache_local._4_4_ == (((byte)pbStack_28[0xa4] & 1) == 0)) {
      SVar7 = Span<const_unsigned_char>::subspan
                        ((Span<const_unsigned_char> *)&mac_secret.size_,0,key_len);
      local_c0 = SVar7.data_;
      key.size_ = (size_t)local_c0;
      local_b8 = (uchar *)SVar7.size_;
      mac_secret.data_ = local_b8;
      SVar7 = Span<const_unsigned_char>::subspan
                        ((Span<const_unsigned_char> *)&mac_secret.size_,key_len << 1,iv_len);
      local_d0 = SVar7.data_;
      iv.size_ = (size_t)local_d0;
      local_c8 = (uchar *)SVar7.size_;
      key.data_ = local_c8;
      SVar7 = Span<const_unsigned_char>::subspan
                        ((Span<const_unsigned_char> *)&mac_secret.size_,key_len * 2 + iv_len * 2,
                         key_block_size);
      local_e0.super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
           (_Head_base<0UL,_bssl::SSLAEADContext_*,_false>)SVar7.data_;
      local_b0 = (undefined1  [8])
                 local_e0.super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
      local_d8 = (uchar *)SVar7.size_;
      iv.data_ = local_d8;
    }
    else {
      SVar7 = Span<const_unsigned_char>::subspan
                        ((Span<const_unsigned_char> *)&mac_secret.size_,key_len,key_len);
      local_f0 = SVar7.data_;
      key.size_ = (size_t)local_f0;
      local_e8 = (uchar *)SVar7.size_;
      mac_secret.data_ = local_e8;
      SVar7 = Span<const_unsigned_char>::subspan
                        ((Span<const_unsigned_char> *)&mac_secret.size_,key_len * 2 + iv_len,iv_len)
      ;
      local_100 = SVar7.data_;
      iv.size_ = (size_t)local_100;
      local_f8 = (uchar *)SVar7.size_;
      key.data_ = local_f8;
      _aead_ctx = Span<const_unsigned_char>::subspan
                            ((Span<const_unsigned_char> *)&mac_secret.size_,
                             key_len * 2 + iv_len * 2 + key_block_size,key_block_size);
      local_b0 = (undefined1  [8])
                 aead_ctx._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
      iv.data_ = local_108;
    }
    bVar3 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&ssl_local);
    if (!bVar3) {
      sVar5 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
      if (sVar5 != key_block_size) {
        iv_override_local.size_._7_1_ = 0;
        goto LAB_003947fd;
      }
      local_b0 = (undefined1  [8])ssl_local;
      iv.data_ = iv_override_local.data_;
    }
    local_128 = iv.size_;
    local_120 = key.data_;
    local_138 = key.size_;
    local_130 = mac_secret.data_;
    local_148._M_head_impl = (SSLAEADContext *)local_b0;
    local_140 = iv.data_;
    SVar7.size_ = (size_t)mac_secret.data_;
    SVar7.data_ = (uchar *)key.size_;
    fixed_iv.size_ = (size_t)iv.data_;
    fixed_iv.data_ = (uchar *)local_b0;
    enc_key.size_ = iv.size_;
    enc_key.data_ = *(uchar **)(mac_secret_len + 0xd8);
    SSLAEADContext::Create
              ((evp_aead_direction_t)&local_118,(uint16_t)key_block_cache_local._4_4_,
               (SSL_CIPHER *)(ulong)*(ushort *)(*(long *)(pbStack_28 + 0x30) + 0xd0),enc_key,SVar7,
               fixed_iv);
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_118);
    pbVar2 = pbStack_28;
    if (bVar3) {
      if (key_block_cache_local._4_4_ == 0) {
        pcVar1 = *(code **)(*(long *)pbStack_28 + 0x98);
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::unique_ptr
                  (&local_158,&local_118);
        Span<const_unsigned_char>::Span(&local_168);
        bVar4 = (*pcVar1)(pbVar2,3,&local_158,local_168.data_,local_168.size_);
        iv_override_local.size_._7_1_ = bVar4 & 1;
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&local_158);
      }
      else {
        pcVar1 = *(code **)(*(long *)pbStack_28 + 0xa0);
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::unique_ptr
                  (local_180,&local_118);
        Span<const_unsigned_char>::Span(&local_190);
        bVar4 = (*pcVar1)(pbVar2,3,local_180,local_190.data_,local_190.size_);
        iv_override_local.size_._7_1_ = bVar4 & 1;
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(local_180);
      }
    }
    else {
      iv_override_local.size_._7_1_ = 0;
    }
    local_14c = 1;
    std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&local_118);
  }
LAB_003947fd:
  return (bool)(iv_override_local.size_._7_1_ & 1);
}

Assistant:

bool tls1_configure_aead(SSL *ssl, evp_aead_direction_t direction,
                         Array<uint8_t> *key_block_cache,
                         const SSL_SESSION *session,
                         Span<const uint8_t> iv_override) {
  size_t mac_secret_len, key_len, iv_len;
  if (!get_key_block_lengths(ssl, &mac_secret_len, &key_len, &iv_len,
                             session->cipher)) {
    return false;
  }

  // Ensure that |key_block_cache| is set up.
  const size_t key_block_size = 2 * (mac_secret_len + key_len + iv_len);
  if (key_block_cache->empty()) {
    if (!key_block_cache->InitForOverwrite(key_block_size) ||
        !generate_key_block(ssl, Span(*key_block_cache), session)) {
      return false;
    }
  }
  assert(key_block_cache->size() == key_block_size);

  Span<const uint8_t> key_block = *key_block_cache;
  Span<const uint8_t> mac_secret, key, iv;
  if (direction == (ssl->server ? evp_aead_open : evp_aead_seal)) {
    // Use the client write (server read) keys.
    mac_secret = key_block.subspan(0, mac_secret_len);
    key = key_block.subspan(2 * mac_secret_len, key_len);
    iv = key_block.subspan(2 * mac_secret_len + 2 * key_len, iv_len);
  } else {
    // Use the server write (client read) keys.
    mac_secret = key_block.subspan(mac_secret_len, mac_secret_len);
    key = key_block.subspan(2 * mac_secret_len + key_len, key_len);
    iv = key_block.subspan(2 * mac_secret_len + 2 * key_len + iv_len, iv_len);
  }

  if (!iv_override.empty()) {
    if (iv_override.size() != iv_len) {
      return false;
    }
    iv = iv_override;
  }

  UniquePtr<SSLAEADContext> aead_ctx = SSLAEADContext::Create(
      direction, ssl->s3->version, session->cipher, key, mac_secret, iv);
  if (!aead_ctx) {
    return false;
  }

  if (direction == evp_aead_open) {
    return ssl->method->set_read_state(ssl, ssl_encryption_application,
                                       std::move(aead_ctx),
                                       /*traffic_secret=*/{});
  }

  return ssl->method->set_write_state(ssl, ssl_encryption_application,
                                      std::move(aead_ctx),
                                      /*traffic_secret=*/{});
}